

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaNormalTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmNinjaNormalTargetGenerator::WriteCxxModuleLibraryStatement
          (cmNinjaNormalTargetGenerator *this,string *config,string *param_2,bool firstForConfig)

{
  cmLocalNinjaGenerator *pcVar1;
  cmGeneratorTarget *pcVar2;
  cmGlobalNinjaGenerator *pcVar3;
  cmNinjaDeps *outputs;
  cmGeneratedFileStream *os;
  string local_228;
  allocator<char> local_201;
  string local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  allocator<char> local_169;
  string local_168;
  undefined1 local_148 [8];
  cmNinjaBuild build;
  bool firstForConfig_local;
  string *param_2_local;
  string *config_local;
  cmNinjaNormalTargetGenerator *this_local;
  
  build.RspFile.field_2._M_local_buf[0xf] = firstForConfig;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_168,"phony",&local_169);
  cmNinjaBuild::cmNinjaBuild((cmNinjaBuild *)local_148,&local_168);
  std::__cxx11::string::~string((string *)&local_168);
  std::allocator<char>::~allocator(&local_169);
  cmNinjaTargetGenerator::GetTargetName_abi_cxx11_(&local_1c0,&this->super_cmNinjaTargetGenerator);
  cmStrCat<char_const(&)[29],std::__cxx11::string>
            (&local_1a0,(char (*) [29])"Imported C++ module library ",&local_1c0);
  std::__cxx11::string::operator=((string *)local_148,(string *)&local_1a0);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::__cxx11::string::~string((string *)&local_1c0);
  pcVar1 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
  pcVar2 = cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
  cmLocalNinjaGenerator::AppendTargetOutputs
            (pcVar1,pcVar2,(cmNinjaDeps *)((long)&build.Rule.field_2 + 8),config);
  if ((build.RspFile.field_2._M_local_buf[0xf] & 1U) != 0) {
    pcVar1 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
    pcVar2 = cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
    pcVar3 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
    outputs = cmGlobalNinjaGenerator::GetByproductsForCleanTarget(pcVar3,config);
    cmLocalNinjaGenerator::AppendTargetOutputs(pcVar1,pcVar2,outputs,config);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_200,"CXX",&local_201);
  cmNinjaTargetGenerator::GetDyndepFilePath
            (&local_1e0,&this->super_cmNinjaTargetGenerator,&local_200,config);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &build.WorkDirOuts.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_1e0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_200);
  std::allocator<char>::~allocator(&local_201);
  pcVar3 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  os = cmNinjaTargetGenerator::GetCommonFileStream(&this->super_cmNinjaTargetGenerator);
  cmGlobalNinjaGenerator::WriteBuild(pcVar3,(ostream *)os,(cmNinjaBuild *)local_148,0,(bool *)0x0);
  cmNinjaBuild::~cmNinjaBuild((cmNinjaBuild *)local_148);
  pcVar3 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  cmNinjaTargetGenerator::GetTargetName_abi_cxx11_(&local_228,&this->super_cmNinjaTargetGenerator);
  pcVar2 = cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
  cmGlobalNinjaGenerator::AddTargetAlias(pcVar3,&local_228,pcVar2,config);
  std::__cxx11::string::~string((string *)&local_228);
  return;
}

Assistant:

void cmNinjaNormalTargetGenerator::WriteCxxModuleLibraryStatement(
  const std::string& config, const std::string& /*fileConfig*/,
  bool firstForConfig)
{
  // TODO: How to use `fileConfig` properly?

  // Write a phony output that depends on the scanning output.
  {
    cmNinjaBuild build("phony");
    build.Comment =
      cmStrCat("Imported C++ module library ", this->GetTargetName());
    this->GetLocalGenerator()->AppendTargetOutputs(this->GetGeneratorTarget(),
                                                   build.Outputs, config);
    if (firstForConfig) {
      this->GetLocalGenerator()->AppendTargetOutputs(
        this->GetGeneratorTarget(),
        this->GetGlobalGenerator()->GetByproductsForCleanTarget(config),
        config);
    }
    build.ExplicitDeps.emplace_back(this->GetDyndepFilePath("CXX", config));
    this->GetGlobalGenerator()->WriteBuild(this->GetCommonFileStream(), build);
  }

  // Add aliases for the target name.
  this->GetGlobalGenerator()->AddTargetAlias(
    this->GetTargetName(), this->GetGeneratorTarget(), config);
}